

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O0

int __thiscall CVmFuncPtr::get_fnptr(CVmFuncPtr *this,vm_val_t *v)

{
  int iVar1;
  vm_obj_id_t obj_00;
  vm_val_t *in_RSI;
  undefined8 *in_RDI;
  vm_obj_id_t obj;
  pool_ofs_t entry_ofs;
  pool_ofs_t local_1c;
  int local_4;
  
  iVar1 = CVmPoolInMem::get_ofs(&G_code_pool_X,(char *)*in_RDI,&local_1c);
  if (iVar1 == 0) {
    obj_00 = CVmDynamicFunc::get_obj_from_prefix((uchar *)in_RSI);
    if (obj_00 == 0) {
      vm_val_t::set_nil(in_RSI);
      local_4 = 0;
    }
    else {
      vm_val_t::set_obj(in_RSI,obj_00);
      local_4 = 1;
    }
  }
  else {
    vm_val_t::set_fnptr(in_RSI,local_1c);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmFuncPtr::get_fnptr(VMG_ vm_val_t *v)
{
    /* 
     *   Try translating the method address to a code pool offset.  If that
     *   succeeds, it's a regular static function.  
     */
    pool_ofs_t entry_ofs;
    if (G_code_pool->get_ofs((const char *)p_, &entry_ofs))
    {
        /* it's a regular function call */
        v->set_fnptr(entry_ofs);
        return TRUE;
    }

    /* 
     *   It's not a static function pointer, so it must be a dynamic
     *   function.  A DynamicFunc stores a prefix header before the start of
     *   our method header, containing the DynamicFunc object ID.  Read the
     *   object ID, and return it as a VM_OBJ value.  
     */
    vm_obj_id_t obj = CVmDynamicFunc::get_obj_from_prefix(vmg_ p_);
    if (obj != VM_INVALID_OBJ)
    {
        v->set_obj(obj);
        return TRUE;
    }

    /* we couldn't find any valid object */
    v->set_nil();
    return FALSE;
}